

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O0

int Sim_UtilCountOnes(uint *pSimInfo,int nSimWords)

{
  int local_2c;
  int i;
  int nBytes;
  int nOnes;
  uchar *pBytes;
  int nSimWords_local;
  uint *pSimInfo_local;
  
  i = 0;
  for (local_2c = 0; local_2c < nSimWords << 2; local_2c = local_2c + 1) {
    i = bit_count[*(byte *)((long)pSimInfo + (long)local_2c)] + i;
  }
  return i;
}

Assistant:

int Sim_UtilCountOnes( unsigned * pSimInfo, int nSimWords )
{
    unsigned char * pBytes;
    int nOnes, nBytes, i;
    pBytes = (unsigned char *)pSimInfo;
    nBytes = 4 * nSimWords;
    nOnes  = 0;
    for ( i = 0; i < nBytes; i++ )
        nOnes += bit_count[ pBytes[i] ];
    return nOnes;    
}